

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser.cc
# Opt level: O1

bool __thiscall DyndepParser::ParseEdge(DyndepParser *this,string *err)

{
  StringPiece path_00;
  StringPiece path_01;
  StringPiece path_02;
  byte bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Node *pNVar5;
  long *plVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  uint uVar8;
  _Base_ptr *pp_Var9;
  pointer this_00;
  _Alloc_hider this_01;
  Lexer *this_02;
  byte unaff_R13B;
  pair<std::_Rb_tree_iterator<std::pair<Edge_*const,_Dyndeps>_>,_bool> pVar10;
  string path;
  EvalString out;
  string rule_name;
  vector<EvalString,_std::allocator<EvalString>_> ins;
  vector<EvalString,_std::allocator<EvalString>_> outs;
  Node *n;
  uint64_t slash_bits;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  void *pvStack_118;
  undefined8 local_110;
  long lStack_108;
  DyndepParser *local_f8;
  _Base_ptr *local_f0;
  undefined1 local_e8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  pointer local_c8;
  pointer ppNStack_c0;
  pointer local_b8;
  pointer ppNStack_b0;
  EvalString local_a8;
  string local_88;
  Node *local_60;
  EvalString local_58;
  _Base_ptr *local_38;
  
  local_a8.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_02 = &(this->super_Parser).lexer_;
  bVar2 = Lexer::ReadEvalString(this_02,&local_a8,true,err);
  if (bVar2) {
    if (local_a8.parsed_.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_a8.parsed_.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_e8 = (undefined1  [8])&local_d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"expected path","");
      unaff_R13B = Lexer::Error(this_02,(string *)local_e8,err);
      if (local_e8 != (undefined1  [8])&local_d8) {
        operator_delete((void *)local_e8,local_d8._M_allocated_capacity + 1);
      }
      uVar8 = 0;
      pp_Var9 = (_Base_ptr *)0x0;
    }
    else {
      EvalString::Evaluate_abi_cxx11_(&local_158,&local_a8,(Env *)&this->env_);
      local_88._M_string_length = 0;
      local_88.field_2._M_allocated_capacity =
           local_88.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      bVar2 = CanonicalizePath(&local_158,(uint64_t *)&local_58,&local_88);
      if (bVar2) {
        path_00.len_ = local_158._M_string_length;
        path_00.str_ = local_158._M_dataplus._M_p;
        pNVar5 = State::LookupNode((this->super_Parser).state_,path_00);
        if ((pNVar5 == (Node *)0x0) ||
           (local_e8 = (undefined1  [8])pNVar5->in_edge_, local_e8 == (undefined1  [8])0x0)) {
          std::operator+(&local_138,"no build statement exists for \'",&local_158);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_138);
          paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 == paVar7) {
            local_d8._M_allocated_capacity = paVar7->_M_allocated_capacity;
            local_d8._8_8_ = plVar6[3];
            local_e8 = (undefined1  [8])&local_d8;
          }
          else {
            local_d8._M_allocated_capacity = paVar7->_M_allocated_capacity;
            local_e8 = (undefined1  [8])*plVar6;
          }
          paStack_e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)plVar6[1];
          *plVar6 = (long)paVar7;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          unaff_R13B = Lexer::Error(this_02,(string *)local_e8,err);
          if (local_e8 != (undefined1  [8])&local_d8) {
            operator_delete((void *)local_e8,local_d8._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT62(local_138._M_dataplus._M_p._2_6_,local_138._M_dataplus._M_p._0_2_) !=
              &local_138.field_2) {
            operator_delete((undefined1 *)
                            CONCAT62(local_138._M_dataplus._M_p._2_6_,
                                     local_138._M_dataplus._M_p._0_2_),
                            local_138.field_2._M_allocated_capacity + 1);
          }
          goto LAB_00112abe;
        }
        local_138._M_dataplus._M_p._0_2_ = 0;
        paStack_e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)((ulong)paStack_e0 & 0xffffffffffff0000);
        local_d8._M_allocated_capacity = 0;
        local_d8._8_8_ = (pointer)0x0;
        local_c8 = (pointer)0x0;
        ppNStack_c0 = (pointer)0x0;
        local_138._M_string_length = 0;
        local_138.field_2._M_allocated_capacity = 0;
        local_138.field_2._8_8_ = 0;
        local_b8 = (pointer)0x0;
        ppNStack_b0 = (pointer)0x0;
        lStack_108 = 0;
        pvStack_118 = (void *)0x0;
        local_110 = 0;
        pVar10 = std::
                 _Rb_tree<Edge*,std::pair<Edge*const,Dyndeps>,std::_Select1st<std::pair<Edge*const,Dyndeps>>,std::less<Edge*>,std::allocator<std::pair<Edge*const,Dyndeps>>>
                 ::_M_insert_unique<std::pair<Edge*const,Dyndeps>>
                           ((_Rb_tree<Edge*,std::pair<Edge*const,Dyndeps>,std::_Select1st<std::pair<Edge*const,Dyndeps>>,std::less<Edge*>,std::allocator<std::pair<Edge*const,Dyndeps>>>
                             *)this->dyndep_file_,(pair<Edge_*const,_Dyndeps> *)local_e8);
        uVar8 = pVar10._8_4_;
        if (ppNStack_c0 != (pointer)0x0) {
          operator_delete(ppNStack_c0,(long)ppNStack_b0 - (long)ppNStack_c0);
        }
        if ((pointer)local_d8._M_allocated_capacity != (pointer)0x0) {
          operator_delete((void *)local_d8._M_allocated_capacity,(long)local_c8 - local_d8._0_8_);
        }
        if (pvStack_118 != (void *)0x0) {
          operator_delete(pvStack_118,lStack_108 - (long)pvStack_118);
        }
        if ((void *)local_138._M_string_length != (void *)0x0) {
          operator_delete((void *)local_138._M_string_length,
                          local_138.field_2._8_8_ - local_138._M_string_length);
        }
        if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          std::operator+(&local_138,"multiple statements for \'",&local_158);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_138);
          paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 == paVar7) {
            local_d8._M_allocated_capacity = paVar7->_M_allocated_capacity;
            local_d8._8_8_ = plVar6[3];
            local_e8 = (undefined1  [8])&local_d8;
          }
          else {
            local_d8._M_allocated_capacity = paVar7->_M_allocated_capacity;
            local_e8 = (undefined1  [8])*plVar6;
          }
          paStack_e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)plVar6[1];
          *plVar6 = (long)paVar7;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          unaff_R13B = Lexer::Error(this_02,(string *)local_e8,err);
          if (local_e8 != (undefined1  [8])&local_d8) {
            operator_delete((void *)local_e8,local_d8._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT62(local_138._M_dataplus._M_p._2_6_,local_138._M_dataplus._M_p._0_2_) !=
              &local_138.field_2) {
            operator_delete((undefined1 *)
                            CONCAT62(local_138._M_dataplus._M_p._2_6_,
                                     local_138._M_dataplus._M_p._0_2_),
                            local_138.field_2._M_allocated_capacity + 1);
          }
          goto LAB_00112ac0;
        }
        pp_Var9 = &pVar10.first._M_node._M_node[1]._M_parent;
      }
      else {
        unaff_R13B = Lexer::Error(this_02,&local_88,err);
LAB_00112abe:
        uVar8 = 0;
LAB_00112ac0:
        pp_Var9 = (_Base_ptr *)0x0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    uVar8 = 0;
    pp_Var9 = (_Base_ptr *)0x0;
    unaff_R13B = 0;
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ::~vector(&local_a8.parsed_);
  if ((uVar8 & 1) == 0) goto LAB_00112d90;
  local_138._M_dataplus._M_p._0_2_ = 0;
  local_138._M_dataplus._M_p._2_6_ = 0;
  local_138._M_string_length = 0;
  local_138.field_2._M_allocated_capacity = 0;
  bVar2 = Lexer::ReadEvalString(this_02,(EvalString *)&local_138,true,err);
  local_f0 = pp_Var9;
  if (bVar2) {
    if (CONCAT62(local_138._M_dataplus._M_p._2_6_,local_138._M_dataplus._M_p._0_2_) ==
        local_138._M_string_length) {
      bVar2 = true;
    }
    else {
      local_e8 = (undefined1  [8])&local_d8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e8,"explicit outputs not supported","");
      unaff_R13B = Lexer::Error(this_02,(string *)local_e8,err);
      if (local_e8 != (undefined1  [8])&local_d8) {
        operator_delete((void *)local_e8,local_d8._M_allocated_capacity + 1);
      }
      bVar2 = false;
    }
  }
  else {
    bVar2 = false;
    unaff_R13B = 0;
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
             *)&local_138);
  if (!bVar2) goto LAB_00112d90;
  local_88._M_dataplus._M_p = (pointer)0x0;
  local_88._M_string_length = 0;
  local_88.field_2._M_allocated_capacity = 0;
  bVar2 = Lexer::PeekToken(this_02,PIPE);
  if (bVar2) {
    local_f8 = this;
    do {
      local_e8 = (undefined1  [8])0x0;
      paStack_e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
      local_d8._M_allocated_capacity = 0;
      bVar2 = Lexer::ReadEvalString(this_02,(EvalString *)local_e8,true,err);
      iVar4 = 1;
      bVar1 = err != (string *)0x0;
      if (bVar2) {
        bVar1 = unaff_R13B;
        if (local_e8 == (undefined1  [8])paStack_e0) {
          iVar4 = 2;
        }
        else {
          iVar4 = 0;
          std::vector<EvalString,_std::allocator<EvalString>_>::push_back
                    ((vector<EvalString,_std::allocator<EvalString>_> *)&local_88,
                     (EvalString *)local_e8);
        }
      }
      unaff_R13B = bVar1;
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                 *)local_e8);
    } while (iVar4 == 0);
    this = local_f8;
    if (iVar4 == 2) goto LAB_00112ca8;
  }
  else {
LAB_00112ca8:
    bVar2 = Parser::ExpectToken(&this->super_Parser,COLON,err);
    if (bVar2) {
      paStack_e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
      local_d8._M_allocated_capacity = local_d8._M_allocated_capacity & 0xffffffffffffff00;
      local_e8 = (undefined1  [8])&local_d8;
      bVar2 = Lexer::ReadIdent(this_02,(string *)local_e8);
      if ((bVar2) && (iVar4 = std::__cxx11::string::compare(local_e8), iVar4 == 0)) {
        local_158._M_dataplus._M_p = (pointer)0x0;
        local_158._M_string_length = 0;
        local_158.field_2._M_allocated_capacity = 0;
        bVar2 = Lexer::ReadEvalString(this_02,(EvalString *)&local_158,true,err);
        if (bVar2) {
          if (local_158._M_dataplus._M_p == (pointer)local_158._M_string_length) {
            bVar2 = true;
          }
          else {
            paVar7 = &local_138.field_2;
            local_138._M_dataplus._M_p._0_2_ = SUB82(paVar7,0);
            local_138._M_dataplus._M_p._2_6_ = (undefined6)((ulong)paVar7 >> 0x10);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_138,"explicit inputs not supported","");
            unaff_R13B = Lexer::Error(this_02,&local_138,err);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT62(local_138._M_dataplus._M_p._2_6_,local_138._M_dataplus._M_p._0_2_) !=
                paVar7) {
              operator_delete((undefined1 *)
                              CONCAT62(local_138._M_dataplus._M_p._2_6_,
                                       local_138._M_dataplus._M_p._0_2_),
                              local_138.field_2._M_allocated_capacity + 1);
            }
            bVar2 = false;
          }
        }
        else {
          bVar2 = false;
          unaff_R13B = 0;
        }
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                   *)&local_158);
        if (bVar2) {
          local_a8.parsed_.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_a8.parsed_.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_a8.parsed_.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          bVar2 = Lexer::PeekToken(this_02,PIPE);
          if (bVar2) {
            local_f8 = this;
            do {
              local_138._M_dataplus._M_p._0_2_ = 0;
              local_138._M_dataplus._M_p._2_6_ = 0;
              local_138._M_string_length = 0;
              local_138.field_2._M_allocated_capacity = 0;
              bVar2 = Lexer::ReadEvalString(this_02,(EvalString *)&local_138,true,err);
              iVar4 = 1;
              bVar1 = err != (string *)0x0;
              if (bVar2) {
                bVar1 = unaff_R13B;
                if (CONCAT62(local_138._M_dataplus._M_p._2_6_,local_138._M_dataplus._M_p._0_2_) ==
                    local_138._M_string_length) {
                  iVar4 = 4;
                }
                else {
                  iVar4 = 0;
                  std::vector<EvalString,_std::allocator<EvalString>_>::push_back
                            ((vector<EvalString,_std::allocator<EvalString>_> *)&local_a8,
                             (value_type *)&local_138);
                }
              }
              unaff_R13B = bVar1;
              std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
              ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                         *)&local_138);
            } while (iVar4 == 0);
            this = local_f8;
            if (iVar4 == 4) goto LAB_00113017;
          }
          else {
LAB_00113017:
            pp_Var9 = local_f0;
            bVar2 = Lexer::PeekToken(this_02,PIPE2);
            if (bVar2) {
              paVar7 = &local_138.field_2;
              local_138._M_dataplus._M_p._0_2_ = SUB82(paVar7,0);
              local_138._M_dataplus._M_p._2_6_ = (undefined6)((ulong)paVar7 >> 0x10);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_138,"order-only inputs not supported","");
              unaff_R13B = Lexer::Error(this_02,&local_138,err);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT62(local_138._M_dataplus._M_p._2_6_,local_138._M_dataplus._M_p._0_2_) !=
                  paVar7) {
                operator_delete((undefined1 *)
                                CONCAT62(local_138._M_dataplus._M_p._2_6_,
                                         local_138._M_dataplus._M_p._0_2_),
                                local_138.field_2._M_allocated_capacity + 1);
              }
            }
            else {
              bVar2 = Parser::ExpectToken(&this->super_Parser,NEWLINE,err);
              if (bVar2) {
                bVar2 = Lexer::PeekToken(this_02,INDENT);
                if (bVar2) {
                  paVar7 = &local_138.field_2;
                  local_138._M_dataplus._M_p._0_2_ = SUB82(paVar7,0);
                  local_138._M_dataplus._M_p._2_6_ = (undefined6)((ulong)paVar7 >> 0x10);
                  local_138._M_string_length = 0;
                  local_138.field_2._M_allocated_capacity =
                       local_138.field_2._M_allocated_capacity & 0xffffffffffffff00;
                  local_58.parsed_.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  local_58.parsed_.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  local_58.parsed_.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  bVar2 = ParseLet(this,&local_138,&local_58,err);
                  if (bVar2) {
                    iVar4 = std::__cxx11::string::compare((char *)&local_138);
                    if (iVar4 == 0) {
                      EvalString::Evaluate_abi_cxx11_(&local_158,&local_58,(Env *)&this->env_);
                      *(bool *)((long)pp_Var9 + 1) =
                           (char *)local_158._M_string_length != (char *)0x0;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_158._M_dataplus._M_p != &local_158.field_2) {
                        operator_delete(local_158._M_dataplus._M_p,
                                        local_158.field_2._M_allocated_capacity + 1);
                      }
                      bVar2 = true;
                    }
                    else {
                      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_158,"binding is not \'restat\'","");
                      unaff_R13B = Lexer::Error(this_02,&local_158,err);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_158._M_dataplus._M_p != &local_158.field_2) {
                        operator_delete(local_158._M_dataplus._M_p,
                                        local_158.field_2._M_allocated_capacity + 1);
                      }
                      bVar2 = false;
                    }
                  }
                  else {
                    bVar2 = false;
                    unaff_R13B = 0;
                  }
                  std::
                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                  ::~vector(&local_58.parsed_);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT62(local_138._M_dataplus._M_p._2_6_,local_138._M_dataplus._M_p._0_2_)
                      != paVar7) {
                    operator_delete((undefined1 *)
                                    CONCAT62(local_138._M_dataplus._M_p._2_6_,
                                             local_138._M_dataplus._M_p._0_2_),
                                    local_138.field_2._M_allocated_capacity + 1);
                  }
                  pp_Var9 = local_f0;
                  if (!bVar2) goto LAB_0011349c;
                }
                local_38 = pp_Var9 + 1;
                std::vector<Node_*,_std::allocator<Node_*>_>::reserve
                          ((vector<Node_*,_std::allocator<Node_*>_> *)local_38,
                           ((long)local_a8.parsed_.
                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_a8.parsed_.
                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                           -0x5555555555555555);
                bVar2 = local_a8.parsed_.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                        ._M_impl.super__Vector_impl_data._M_start ==
                        local_a8.parsed_.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
                if (!bVar2) {
                  local_f8 = (DyndepParser *)&this->env_;
                  this_00 = local_a8.parsed_.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  do {
                    EvalString::Evaluate_abi_cxx11_
                              (&local_138,(EvalString *)this_00,(Env *)local_f8);
                    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
                    local_158._M_string_length = 0;
                    local_158.field_2._M_allocated_capacity =
                         local_158.field_2._M_allocated_capacity & 0xffffffffffffff00;
                    bVar3 = CanonicalizePath(&local_138,(uint64_t *)&local_58,&local_158);
                    if (bVar3) {
                      path_01.str_._2_6_ = local_138._M_dataplus._M_p._2_6_;
                      path_01.str_._0_2_ = local_138._M_dataplus._M_p._0_2_;
                      path_01.len_ = local_138._M_string_length;
                      local_60 = State::GetNode((this->super_Parser).state_,path_01,
                                                (BindingEnv *)local_f8,
                                                (uint64_t)
                                                local_58.parsed_.
                                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                      std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                                ((vector<Node_*,_std::allocator<Node_*>_> *)local_38,&local_60);
                    }
                    else {
                      unaff_R13B = Lexer::Error(this_02,&local_158,err);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_158._M_dataplus._M_p != &local_158.field_2) {
                      operator_delete(local_158._M_dataplus._M_p,
                                      local_158.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT62(local_138._M_dataplus._M_p._2_6_,
                                    local_138._M_dataplus._M_p._0_2_) != &local_138.field_2) {
                      operator_delete((undefined1 *)
                                      CONCAT62(local_138._M_dataplus._M_p._2_6_,
                                               local_138._M_dataplus._M_p._0_2_),
                                      local_138.field_2._M_allocated_capacity + 1);
                    }
                    if (!bVar3) break;
                    this_00 = (pointer)((long)&(this_00->first).field_2 + 8);
                    bVar2 = this_00 ==
                            local_a8.parsed_.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  } while (!bVar2);
                }
                if (bVar2) {
                  pp_Var9 = local_f0 + 4;
                  std::vector<Node_*,_std::allocator<Node_*>_>::reserve
                            ((vector<Node_*,_std::allocator<Node_*>_> *)pp_Var9,
                             ((long)(local_88._M_string_length - (long)local_88._M_dataplus._M_p) >>
                             3) * -0x5555555555555555);
                  if (local_88._M_dataplus._M_p != (pointer)local_88._M_string_length) {
                    local_f8 = (DyndepParser *)&this->env_;
                    this_01._M_p = local_88._M_dataplus._M_p;
                    local_f0 = pp_Var9;
                    do {
                      EvalString::Evaluate_abi_cxx11_
                                (&local_138,(EvalString *)this_01._M_p,(Env *)local_f8);
                      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
                      local_158._M_string_length = 0;
                      local_158.field_2._M_allocated_capacity =
                           local_158.field_2._M_allocated_capacity & 0xffffffffffffff00;
                      bVar2 = CanonicalizePath(&local_138,(uint64_t *)&local_58,&local_158);
                      if (bVar2) {
                        path_02.str_._2_6_ = local_138._M_dataplus._M_p._2_6_;
                        path_02.str_._0_2_ = local_138._M_dataplus._M_p._0_2_;
                        path_02.len_ = local_138._M_string_length;
                        local_60 = State::GetNode((this->super_Parser).state_,path_02,
                                                  (BindingEnv *)local_f8,
                                                  (uint64_t)
                                                  local_58.parsed_.
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                        std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                                  ((vector<Node_*,_std::allocator<Node_*>_> *)local_f0,&local_60);
                      }
                      else {
                        unaff_R13B = Lexer::Error(this_02,&local_158,err);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_158._M_dataplus._M_p != &local_158.field_2) {
                        operator_delete(local_158._M_dataplus._M_p,
                                        local_158.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT62(local_138._M_dataplus._M_p._2_6_,
                                      local_138._M_dataplus._M_p._0_2_) != &local_138.field_2) {
                        operator_delete((undefined1 *)
                                        CONCAT62(local_138._M_dataplus._M_p._2_6_,
                                                 local_138._M_dataplus._M_p._0_2_),
                                        local_138.field_2._M_allocated_capacity + 1);
                      }
                      if (!bVar2) goto LAB_0011349c;
                      this_01._M_p = this_01._M_p + 0x18;
                    } while (this_01._M_p != (pointer)local_88._M_string_length);
                  }
                  unaff_R13B = 1;
                }
              }
              else {
                unaff_R13B = 0;
              }
            }
          }
LAB_0011349c:
          std::vector<EvalString,_std::allocator<EvalString>_>::~vector
                    ((vector<EvalString,_std::allocator<EvalString>_> *)&local_a8);
        }
      }
      else {
        paVar7 = &local_138.field_2;
        local_138._M_dataplus._M_p._0_2_ = SUB82(paVar7,0);
        local_138._M_dataplus._M_p._2_6_ = (undefined6)((ulong)paVar7 >> 0x10);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_138,"expected build command name \'dyndep\'","");
        unaff_R13B = Lexer::Error(this_02,&local_138,err);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT62(local_138._M_dataplus._M_p._2_6_,local_138._M_dataplus._M_p._0_2_) != paVar7
           ) {
          operator_delete((undefined1 *)
                          CONCAT62(local_138._M_dataplus._M_p._2_6_,local_138._M_dataplus._M_p._0_2_
                                  ),local_138.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_e8 != (undefined1  [8])&local_d8) {
        operator_delete((void *)local_e8,local_d8._M_allocated_capacity + 1);
      }
    }
    else {
      unaff_R13B = 0;
    }
  }
  std::vector<EvalString,_std::allocator<EvalString>_>::~vector
            ((vector<EvalString,_std::allocator<EvalString>_> *)&local_88);
LAB_00112d90:
  return (bool)(unaff_R13B & 1);
}

Assistant:

bool DyndepParser::ParseEdge(string* err) {
  // Parse one explicit output.  We expect it to already have an edge.
  // We will record its dynamically-discovered dependency information.
  Dyndeps* dyndeps = NULL;
  {
    EvalString out0;
    if (!lexer_.ReadPath(&out0, err))
      return false;
    if (out0.empty())
      return lexer_.Error("expected path", err);

    string path = out0.Evaluate(&env_);
    string path_err;
    uint64_t slash_bits;
    if (!CanonicalizePath(&path, &slash_bits, &path_err))
      return lexer_.Error(path_err, err);
    Node* node = state_->LookupNode(path);
    if (!node || !node->in_edge())
      return lexer_.Error("no build statement exists for '" + path + "'", err);
    Edge* edge = node->in_edge();
    std::pair<DyndepFile::iterator, bool> res =
      dyndep_file_->insert(DyndepFile::value_type(edge, Dyndeps()));
    if (!res.second)
      return lexer_.Error("multiple statements for '" + path + "'", err);
    dyndeps = &res.first->second;
  }

  // Disallow explicit outputs.
  {
    EvalString out;
    if (!lexer_.ReadPath(&out, err))
      return false;
    if (!out.empty())
      return lexer_.Error("explicit outputs not supported", err);
  }

  // Parse implicit outputs, if any.
  vector<EvalString> outs;
  if (lexer_.PeekToken(Lexer::PIPE)) {
    for (;;) {
      EvalString out;
      if (!lexer_.ReadPath(&out, err))
        return err;
      if (out.empty())
        break;
      outs.push_back(out);
    }
  }

  if (!ExpectToken(Lexer::COLON, err))
    return false;

  string rule_name;
  if (!lexer_.ReadIdent(&rule_name) || rule_name != "dyndep")
    return lexer_.Error("expected build command name 'dyndep'", err);

  // Disallow explicit inputs.
  {
    EvalString in;
    if (!lexer_.ReadPath(&in, err))
      return false;
    if (!in.empty())
      return lexer_.Error("explicit inputs not supported", err);
  }

  // Parse implicit inputs, if any.
  vector<EvalString> ins;
  if (lexer_.PeekToken(Lexer::PIPE)) {
    for (;;) {
      EvalString in;
      if (!lexer_.ReadPath(&in, err))
        return err;
      if (in.empty())
        break;
      ins.push_back(in);
    }
  }

  // Disallow order-only inputs.
  if (lexer_.PeekToken(Lexer::PIPE2))
    return lexer_.Error("order-only inputs not supported", err);

  if (!ExpectToken(Lexer::NEWLINE, err))
    return false;

  if (lexer_.PeekToken(Lexer::INDENT)) {
    string key;
    EvalString val;
    if (!ParseLet(&key, &val, err))
      return false;
    if (key != "restat")
      return lexer_.Error("binding is not 'restat'", err);
    string value = val.Evaluate(&env_);
    dyndeps->restat_ = !value.empty();
  }

  dyndeps->implicit_inputs_.reserve(ins.size());
  for (vector<EvalString>::iterator i = ins.begin(); i != ins.end(); ++i) {
    string path = i->Evaluate(&env_);
    string path_err;
    uint64_t slash_bits;
    if (!CanonicalizePath(&path, &slash_bits, &path_err))
      return lexer_.Error(path_err, err);
    Node* n = state_->GetNode(path, &env_, slash_bits);
    dyndeps->implicit_inputs_.push_back(n);
  }

  dyndeps->implicit_outputs_.reserve(outs.size());
  for (vector<EvalString>::iterator i = outs.begin(); i != outs.end(); ++i) {
    string path = i->Evaluate(&env_);
    string path_err;
    uint64_t slash_bits;
    if (!CanonicalizePath(&path, &slash_bits, &path_err))
      return lexer_.Error(path_err, err);
    Node* n = state_->GetNode(path, &env_, slash_bits);
    dyndeps->implicit_outputs_.push_back(n);
  }

  return true;
}